

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerType.cpp
# Opt level: O0

void __thiscall hdc::PointerType::~PointerType(PointerType *this)

{
  PointerType *this_local;
  
  (this->super_Type).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00220570;
  if ((this->subtype != (Type *)0x0) && (this->subtype != (Type *)0x0)) {
    (*(this->subtype->super_ASTNode)._vptr_ASTNode[2])();
  }
  Token::~Token(&this->token);
  Type::~Type(&this->super_Type);
  return;
}

Assistant:

PointerType::~PointerType() {
    if (subtype != nullptr) {
        delete subtype;
    }
}